

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_self_test(int verbose)

{
  uchar auVar1 [16];
  uchar auVar2 [16];
  int iVar3;
  uchar (*pauVar4) [16];
  char *pcVar5;
  uint uVar6;
  int iVar7;
  size_t __n;
  uint uVar8;
  uchar (*pauVar9) [48];
  uchar (*pauVar10) [48];
  uchar *__s2;
  uint mode;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t offset;
  uchar buf [64];
  uchar iv [16];
  uchar key [32];
  uchar prv [16];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  uchar tmp [16];
  
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  key[0x18] = '\0';
  key[0x19] = '\0';
  key[0x1a] = '\0';
  key[0x1b] = '\0';
  key[0x1c] = '\0';
  key[0x1d] = '\0';
  key[0x1e] = '\0';
  key[0x1f] = '\0';
  memset(&ctx,0,0x120);
  for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
    uVar6 = (uVar11 >> 1) * 0x40 + 0x80;
    uVar8 = uVar11 & 1;
    if (verbose != 0) {
      pcVar5 = "enc";
      if (uVar8 == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)uVar6,pcVar5);
    }
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    if (uVar8 == 0) {
      iVar3 = mbedtls_aes_setkey_dec(&ctx,key,uVar6);
      pauVar4 = aes_test_ecb_dec;
    }
    else {
      iVar3 = mbedtls_aes_setkey_enc(&ctx,key,uVar6);
      pauVar4 = aes_test_ecb_enc;
    }
    pcVar5 = "skipped";
    if (uVar6 == 0xc0 && iVar3 == -0x23) {
LAB_00139a91:
      puts(pcVar5);
    }
    else {
      if (iVar3 != 0) goto LAB_00139efe;
      pauVar4 = pauVar4 + (uVar11 >> 1);
      iVar7 = 0x2711;
      while (iVar7 = iVar7 + -1, iVar7 != 0) {
        iVar3 = mbedtls_aes_crypt_ecb(&ctx,uVar8,buf,buf);
        if (iVar3 != 0) goto LAB_00139efe;
      }
      auVar12[0] = -((*pauVar4)[0] == buf[0]);
      auVar12[1] = -((*pauVar4)[1] == buf[1]);
      auVar12[2] = -((*pauVar4)[2] == buf[2]);
      auVar12[3] = -((*pauVar4)[3] == buf[3]);
      auVar12[4] = -((*pauVar4)[4] == buf[4]);
      auVar12[5] = -((*pauVar4)[5] == buf[5]);
      auVar12[6] = -((*pauVar4)[6] == buf[6]);
      auVar12[7] = -((*pauVar4)[7] == buf[7]);
      auVar12[8] = -((*pauVar4)[8] == buf[8]);
      auVar12[9] = -((*pauVar4)[9] == buf[9]);
      auVar12[10] = -((*pauVar4)[10] == buf[10]);
      auVar12[0xb] = -((*pauVar4)[0xb] == buf[0xb]);
      auVar12[0xc] = -((*pauVar4)[0xc] == buf[0xc]);
      auVar12[0xd] = -((*pauVar4)[0xd] == buf[0xd]);
      auVar12[0xe] = -((*pauVar4)[0xe] == buf[0xe]);
      auVar12[0xf] = -((*pauVar4)[0xf] == buf[0xf]);
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00139f33;
      pcVar5 = "passed";
      if (verbose != 0) goto LAB_00139a91;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
    uVar6 = (uVar11 >> 1) * 0x40 + 0x80;
    uVar8 = uVar11 & 1;
    if (verbose != 0) {
      pcVar5 = "enc";
      if (uVar8 == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)uVar6,pcVar5);
    }
    iv[0] = '\0';
    iv[1] = '\0';
    iv[2] = '\0';
    iv[3] = '\0';
    iv[4] = '\0';
    iv[5] = '\0';
    iv[6] = '\0';
    iv[7] = '\0';
    iv[8] = '\0';
    iv[9] = '\0';
    iv[10] = '\0';
    iv[0xb] = '\0';
    iv[0xc] = '\0';
    iv[0xd] = '\0';
    iv[0xe] = '\0';
    iv[0xf] = '\0';
    prv[0] = '\0';
    prv[1] = '\0';
    prv[2] = '\0';
    prv[3] = '\0';
    prv[4] = '\0';
    prv[5] = '\0';
    prv[6] = '\0';
    prv[7] = '\0';
    prv[8] = '\0';
    prv[9] = '\0';
    prv[10] = '\0';
    prv[0xb] = '\0';
    prv[0xc] = '\0';
    prv[0xd] = '\0';
    prv[0xe] = '\0';
    prv[0xf] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    if (uVar8 == 0) {
      iVar3 = mbedtls_aes_setkey_dec(&ctx,key,uVar6);
      pauVar4 = aes_test_cbc_dec;
    }
    else {
      iVar3 = mbedtls_aes_setkey_enc(&ctx,key,uVar6);
      pauVar4 = aes_test_cbc_enc;
    }
    pcVar5 = "skipped";
    if (uVar6 == 0xc0 && iVar3 == -0x23) {
LAB_00139bf6:
      puts(pcVar5);
    }
    else {
      if (iVar3 != 0) goto LAB_00139efe;
      pauVar4 = pauVar4 + (uVar11 >> 1);
      iVar7 = 0x2711;
      while (auVar1 = prv, iVar7 = iVar7 + -1, iVar7 != 0) {
        if (uVar8 != 0) {
          prv[0] = buf[0];
          prv[1] = buf[1];
          prv[2] = buf[2];
          prv[3] = buf[3];
          prv[4] = buf[4];
          prv[5] = buf[5];
          prv[6] = buf[6];
          prv[7] = buf[7];
          prv[8] = buf[8];
          prv[9] = buf[9];
          prv[10] = buf[10];
          prv[0xb] = buf[0xb];
          prv[0xc] = buf[0xc];
          prv[0xd] = buf[0xd];
          prv[0xe] = buf[0xe];
          prv[0xf] = buf[0xf];
          auVar2 = prv;
          prv[0] = auVar1[0];
          prv[1] = auVar1[1];
          prv[2] = auVar1[2];
          prv[3] = auVar1[3];
          prv[4] = auVar1[4];
          prv[5] = auVar1[5];
          prv[6] = auVar1[6];
          prv[7] = auVar1[7];
          prv[8] = auVar1[8];
          prv[9] = auVar1[9];
          prv[10] = auVar1[10];
          prv[0xb] = auVar1[0xb];
          prv[0xc] = auVar1[0xc];
          prv[0xd] = auVar1[0xd];
          prv[0xe] = auVar1[0xe];
          prv[0xf] = auVar1[0xf];
          buf[0] = prv[0];
          buf[1] = prv[1];
          buf[2] = prv[2];
          buf[3] = prv[3];
          buf[4] = prv[4];
          buf[5] = prv[5];
          buf[6] = prv[6];
          buf[7] = prv[7];
          buf[8] = prv[8];
          buf[9] = prv[9];
          buf[10] = prv[10];
          buf[0xb] = prv[0xb];
          buf[0xc] = prv[0xc];
          buf[0xd] = prv[0xd];
          buf[0xe] = prv[0xe];
          buf[0xf] = prv[0xf];
          prv = auVar2;
        }
        iVar3 = mbedtls_aes_crypt_cbc(&ctx,uVar8,0x10,iv,buf,buf);
        if (iVar3 != 0) goto LAB_00139efe;
      }
      auVar13[0] = -((*pauVar4)[0] == buf[0]);
      auVar13[1] = -((*pauVar4)[1] == buf[1]);
      auVar13[2] = -((*pauVar4)[2] == buf[2]);
      auVar13[3] = -((*pauVar4)[3] == buf[3]);
      auVar13[4] = -((*pauVar4)[4] == buf[4]);
      auVar13[5] = -((*pauVar4)[5] == buf[5]);
      auVar13[6] = -((*pauVar4)[6] == buf[6]);
      auVar13[7] = -((*pauVar4)[7] == buf[7]);
      auVar13[8] = -((*pauVar4)[8] == buf[8]);
      auVar13[9] = -((*pauVar4)[9] == buf[9]);
      auVar13[10] = -((*pauVar4)[10] == buf[10]);
      auVar13[0xb] = -((*pauVar4)[0xb] == buf[0xb]);
      auVar13[0xc] = -((*pauVar4)[0xc] == buf[0xc]);
      auVar13[0xd] = -((*pauVar4)[0xd] == buf[0xd]);
      auVar13[0xe] = -((*pauVar4)[0xe] == buf[0xe]);
      auVar13[0xf] = -((*pauVar4)[0xf] == buf[0xf]);
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00139f33;
      pcVar5 = "passed";
      if (verbose != 0) goto LAB_00139bf6;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
    uVar8 = uVar11 >> 1;
    uVar6 = uVar8 * 0x40 + 0x80;
    mode = uVar11 & 1;
    if (verbose != 0) {
      pcVar5 = "enc";
      if (mode == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)uVar6,pcVar5);
    }
    iv[8] = '\b';
    iv[9] = '\t';
    iv[10] = '\n';
    iv[0xb] = '\v';
    iv[0xc] = '\f';
    iv[0xd] = '\r';
    iv[0xe] = '\x0e';
    iv[0xf] = '\x0f';
    iv[0] = '\0';
    iv[1] = '\x01';
    iv[2] = '\x02';
    iv[3] = '\x03';
    iv[4] = '\x04';
    iv[5] = '\x05';
    iv[6] = '\x06';
    iv[7] = '\a';
    memcpy(key,aes_test_cfb128_key + uVar8,(ulong)(uVar6 >> 3));
    offset = 0;
    iVar3 = mbedtls_aes_setkey_enc(&ctx,key,uVar6);
    pcVar5 = "skipped";
    if (uVar6 == 0xc0 && iVar3 == -0x23) {
LAB_00139da6:
      puts(pcVar5);
    }
    else {
      if (iVar3 != 0) goto LAB_00139efe;
      if (mode == 0) {
        buf._0_16_ = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar8];
        buf._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar8] + 0x10);
        buf._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar8] + 0x18);
        buf._32_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar8] + 0x20);
        buf._40_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar8] + 0x28);
        buf._48_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar8] + 0x30);
        buf._56_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar8] + 0x38);
        __s2 = aes_test_cfb128_pt;
      }
      else {
        buf[0x30] = 0xf6;
        buf[0x31] = 0x9f;
        buf[0x32] = '$';
        buf[0x33] = 'E';
        buf[0x34] = 0xdf;
        buf[0x35] = 'O';
        buf[0x36] = 0x9b;
        buf[0x37] = '\x17';
        buf[0x38] = 0xad;
        buf[0x39] = '+';
        buf[0x3a] = 'A';
        buf[0x3b] = '{';
        buf[0x3c] = 0xe6;
        buf[0x3d] = 'l';
        buf[0x3e] = '7';
        buf[0x3f] = '\x10';
        buf[0x20] = '0';
        buf[0x21] = 200;
        buf[0x22] = '\x1c';
        buf[0x23] = 'F';
        buf[0x24] = 0xa3;
        buf[0x25] = '\\';
        buf[0x26] = 0xe4;
        buf[0x27] = '\x11';
        buf[0x28] = 0xe5;
        buf[0x29] = 0xfb;
        buf[0x2a] = 0xc1;
        buf[0x2b] = '\x19';
        buf[0x2c] = '\x1a';
        buf[0x2d] = '\n';
        buf[0x2e] = 'R';
        buf[0x2f] = 0xef;
        buf[0x10] = 0xae;
        buf[0x11] = '-';
        buf[0x12] = 0x8a;
        buf[0x13] = 'W';
        buf[0x14] = '\x1e';
        buf[0x15] = '\x03';
        buf[0x16] = 0xac;
        buf[0x17] = 0x9c;
        buf[0x18] = 0x9e;
        buf[0x19] = 0xb7;
        buf[0x1a] = 'o';
        buf[0x1b] = 0xac;
        buf[0x1c] = 'E';
        buf[0x1d] = 0xaf;
        buf[0x1e] = 0x8e;
        buf[0x1f] = 'Q';
        buf[8] = 0xe9;
        buf[9] = '=';
        buf[10] = '~';
        buf[0xb] = '\x11';
        buf[0xc] = 's';
        buf[0xd] = 0x93;
        buf[0xe] = '\x17';
        buf[0xf] = '*';
        buf[0] = 'k';
        buf[1] = 0xc1;
        buf[2] = 0xbe;
        buf[3] = 0xe2;
        buf[4] = '.';
        buf[5] = '@';
        buf[6] = 0x9f;
        buf[7] = 0x96;
        __s2 = aes_test_cfb128_ct[uVar8];
      }
      mbedtls_aes_crypt_cfb128(&ctx,mode,0x40,&offset,iv,buf,buf);
      iVar3 = bcmp(buf,__s2,0x40);
      if (iVar3 != 0) goto LAB_00139f33;
      pcVar5 = "passed";
      if (verbose != 0) goto LAB_00139da6;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar11 = 0; uVar11 != 6; uVar11 = uVar11 + 1) {
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar11 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar5);
    }
    uVar6 = uVar11 >> 1;
    nonce_counter._0_8_ = *(undefined8 *)aes_test_ctr_nonce_counter[uVar6];
    nonce_counter._8_8_ = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar6] + 8);
    key._0_16_ = *(undefined1 (*) [16])(aes_test_ctr_key + uVar6);
    offset = 0;
    iVar3 = mbedtls_aes_setkey_enc(&ctx,key,0x80);
    if (iVar3 != 0) goto LAB_00139efe;
    __n = (size_t)aes_test_ctr_len[uVar6];
    pauVar9 = aes_test_ctr_pt;
    pauVar10 = aes_test_ctr_ct;
    if ((uVar11 & 1) == 0) {
      pauVar9 = aes_test_ctr_ct;
      pauVar10 = aes_test_ctr_pt;
    }
    memcpy(buf,pauVar9 + uVar6,__n);
    mbedtls_aes_crypt_ctr(&ctx,__n,&offset,nonce_counter,stream_block,buf,buf);
    iVar3 = bcmp(buf,pauVar10 + uVar6,__n);
    if (iVar3 != 0) goto LAB_00139f33;
    if (verbose != 0) {
      puts("passed");
    }
  }
  iVar3 = 0;
  if (verbose != 0) {
    putchar(10);
  }
LAB_00139f11:
  mbedtls_aes_free(&ctx);
  return iVar3;
LAB_00139f33:
  iVar3 = 1;
LAB_00139efe:
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_00139f11;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    int len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}